

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * __thiscall
capnp::_::OrphanBuilder::asText(Builder *__return_storage_ptr__,OrphanBuilder *this)

{
  bool bVar1;
  WirePointer *pWVar2;
  Fault local_18;
  Fault f;
  OrphanBuilder *this_local;
  
  f.exception = (Exception *)this;
  pWVar2 = tagAsPtr(this);
  bVar1 = WirePointer::isNull(pWVar2);
  if (bVar1 == (this->location == (word *)0x0)) {
    pWVar2 = tagAsPtr(this);
    WireHelpers::getWritableTextPointer
              (__return_storage_ptr__,pWVar2,this->location,this->segment,this->capTable,(void *)0x0
               ,0);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
             ,0xdfc,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","");
  kj::_::Debug::Fault::fatal(&local_18);
}

Assistant:

Text::Builder OrphanBuilder::asText() {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  // Never relocates.
  return WireHelpers::getWritableTextPointer(
      tagAsPtr(), location, segment, capTable, nullptr, ZERO * BYTES);
}